

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_new_inner(lyd_node *parent,lys_module *module,char *name,ly_bool output,lyd_node **node)

{
  ly_ctx *plVar1;
  LY_ERR LVar2;
  lys_module *plVar3;
  size_t prefix_len;
  size_t name_len;
  lysc_node *plVar4;
  char *pcVar5;
  ly_ctx *ctx;
  lyd_node *ret;
  lysc_ext_instance *ext;
  lysc_node *schema;
  
  ret = (lyd_node *)0x0;
  ext = (lysc_ext_instance *)0x0;
  if (parent == (lyd_node *)0x0) {
    plVar3 = module;
    if (module != (lys_module *)0x0) goto LAB_0012b82a;
    ctx = (ly_ctx *)0x0;
  }
  else {
    if (parent->schema == (lysc_node *)0x0) {
      plVar3 = (lys_module *)&parent[2].schema;
    }
    else {
      plVar3 = parent->schema->module;
    }
LAB_0012b82a:
    ctx = plVar3->ctx;
  }
  if (parent == (lyd_node *)0x0 && module == (lys_module *)0x0) {
    pcVar5 = "parent || module";
  }
  else if (parent == (lyd_node *)0x0 && node == (lyd_node **)0x0) {
    pcVar5 = "parent || node";
  }
  else {
    if (name != (char *)0x0) {
      if (parent != (lyd_node *)0x0) {
        plVar4 = parent->schema;
        if (plVar4 == (lysc_node *)0x0) {
          if (module == (lys_module *)0x0) goto LAB_0012b903;
          plVar1 = (ly_ctx *)parent[2].schema;
        }
        else {
          if (module == (lys_module *)0x0) goto LAB_0012b903;
          plVar1 = plVar4->module->ctx;
        }
        if ((plVar1 != (ly_ctx *)0x0) && (module->ctx != (ly_ctx *)0x0)) {
          if (plVar4 == (lysc_node *)0x0) {
            plVar3 = (lys_module *)&parent[2].schema;
          }
          else {
            plVar3 = plVar4->module;
          }
          if (plVar3->ctx != module->ctx) {
            if (plVar4 == (lysc_node *)0x0) {
              plVar3 = (lys_module *)&parent[2].schema;
            }
            else {
              plVar3 = plVar4->module;
            }
            ly_log(plVar3->ctx,LY_LLERR,LY_EINVAL,
                   "Different contexts mixed in a single function call.");
            return LY_EINVAL;
          }
        }
      }
LAB_0012b903:
      if (module == (lys_module *)0x0) {
        module = parent->schema->module;
      }
      if (parent == (lyd_node *)0x0) {
        plVar4 = (lysc_node *)0x0;
      }
      else {
        plVar4 = parent->schema;
      }
      schema = lys_find_child(plVar4,module,name,0,0x701,(uint)(output != '\0') << 4);
      if ((parent != (lyd_node *)0x0) && (schema == (lysc_node *)0x0)) {
        pcVar5 = module->name;
        prefix_len = strlen(pcVar5);
        name_len = strlen(name);
        LVar2 = ly_nested_ext_schema
                          (parent,(lysc_node *)0x0,pcVar5,prefix_len,LY_VALUE_JSON,(void *)0x0,name,
                           name_len,&schema,&ext);
        if ((LVar2 != LY_ENOT) && (LVar2 != LY_SUCCESS)) {
          return LVar2;
        }
      }
      if (schema == (lysc_node *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,
               "Inner node (container, notif, RPC, or action) \"%s\" not found.",name);
        return LY_ENOTFOUND;
      }
      LVar2 = lyd_create_inner(schema,&ret);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (ext != (lysc_ext_instance *)0x0) {
        ret->flags = ret->flags | 8;
      }
      if (parent != (lyd_node *)0x0) {
        lyd_insert_node(parent,(lyd_node **)0x0,ret,0);
      }
      if (node == (lyd_node **)0x0) {
        return LY_SUCCESS;
      }
      *node = ret;
      return LY_SUCCESS;
    }
    pcVar5 = "name";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,"lyd_new_inner");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_inner(struct lyd_node *parent, const struct lys_module *module, const char *name, ly_bool output,
        struct lyd_node **node)
{
    LY_ERR r;
    struct lyd_node *ret = NULL;
    const struct lysc_node *schema;
    struct lysc_ext_instance *ext = NULL;
    const struct ly_ctx *ctx = parent ? LYD_CTX(parent) : (module ? module->ctx : NULL);

    LY_CHECK_ARG_RET(ctx, parent || module, parent || node, name, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(parent ? LYD_CTX(parent) : NULL, module ? module->ctx : NULL, LY_EINVAL);

    if (!module) {
        module = parent->schema->module;
    }

    schema = lys_find_child(parent ? parent->schema : NULL, module, name, 0,
            LYS_CONTAINER | LYS_NOTIF | LYS_RPC | LYS_ACTION, output ? LYS_GETNEXT_OUTPUT : 0);
    if (!schema && parent) {
        r = ly_nested_ext_schema(parent, NULL, module->name, strlen(module->name), LY_VALUE_JSON, NULL, name,
                strlen(name), &schema, &ext);
        LY_CHECK_RET(r && (r != LY_ENOT), r);
    }
    LY_CHECK_ERR_RET(!schema, LOGERR(ctx, LY_EINVAL, "Inner node (container, notif, RPC, or action) \"%s\" not found.",
            name), LY_ENOTFOUND);

    LY_CHECK_RET(lyd_create_inner(schema, &ret));
    if (ext) {
        ret->flags |= LYD_EXT;
    }
    if (parent) {
        lyd_insert_node(parent, NULL, ret, LYD_INSERT_NODE_DEFAULT);
    }

    if (node) {
        *node = ret;
    }
    return LY_SUCCESS;
}